

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int fts5FindTokenizer(fts5_api *pApi,char *zName,void **ppUserData,fts5_tokenizer *pTokenizer)

{
  _func_void_Fts5Tokenizer_ptr *p_Var1;
  int iVar2;
  Fts5TokenizerModule *pFVar3;
  Fts5TokenizerModule *pFVar4;
  
  pFVar3 = fts5LocateTokenizer((Fts5Global *)pApi,zName);
  if (pFVar3 == (Fts5TokenizerModule *)0x0) {
    pTokenizer->xCreate = (_func_int_void_ptr_char_ptr_ptr_int_Fts5Tokenizer_ptr_ptr *)0x0;
    pTokenizer->xDelete = (_func_void_Fts5Tokenizer_ptr *)0x0;
    pTokenizer->xTokenize =
         (_func_int_Fts5Tokenizer_ptr_void_ptr_int_char_ptr_int__func_int_void_ptr_int_char_ptr_int_int_int_ptr
          *)0x0;
    *ppUserData = (void *)0x0;
    iVar2 = 1;
  }
  else {
    pFVar4 = pFVar3;
    if (pFVar3->bV2Native == 0) {
      pFVar4 = (Fts5TokenizerModule *)pFVar3->pUserData;
    }
    *ppUserData = pFVar4;
    pTokenizer->xTokenize = (pFVar3->x1).xTokenize;
    p_Var1 = (pFVar3->x1).xDelete;
    pTokenizer->xCreate = (pFVar3->x1).xCreate;
    pTokenizer->xDelete = p_Var1;
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

static int fts5FindTokenizer(
  fts5_api *pApi,                 /* Global context (one per db handle) */
  const char *zName,              /* Name of new function */
  void **ppUserData,
  fts5_tokenizer *pTokenizer      /* Populate this object */
){
  int rc = SQLITE_OK;
  Fts5TokenizerModule *pMod;

  pMod = fts5LocateTokenizer((Fts5Global*)pApi, zName);
  if( pMod ){
    if( pMod->bV2Native==0 ){
      *ppUserData = pMod->pUserData;
    }else{
      *ppUserData = (void*)pMod;
    }
    *pTokenizer = pMod->x1;
  }else{
    memset(pTokenizer, 0, sizeof(*pTokenizer));
    *ppUserData = 0;
    rc = SQLITE_ERROR;
  }

  return rc;
}